

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  void *pvVar5;
  unsigned_long uVar6;
  Extension *pEVar7;
  uint *puVar8;
  void **ppvVar9;
  void **ppvVar10;
  unsigned_long *puVar11;
  bool *pbVar12;
  double *pdVar13;
  float *pfVar14;
  string_view str;
  LogMessage local_30;
  
  pEVar7 = FindOrNull(this,number);
  if (pEVar7 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x39f,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_30,str);
    goto LAB_0023c918;
  }
  if (pEVar7->is_repeated == false) {
    SwapElements((ExtensionSet *)&local_30);
LAB_0023c90e:
    SwapElements((ExtensionSet *)&local_30);
LAB_0023c918:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  if ((byte)(pEVar7->type - 0x13) < 0xee) goto LAB_0023c90e;
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar7->type * 4)) {
  case 1:
  case 8:
    puVar8 = (uint *)RepeatedField<int>::elements
                               ((RepeatedField<int> *)(pEVar7->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 (((RepeatedField<int> *)(pEVar7->field_0).int64_t_value)->soo_rep_)
                                 .field_0 & (undefined1  [16])0x4) == (undefined1  [16])0x0);
    goto LAB_0023c82b;
  case 2:
    puVar11 = (unsigned_long *)
              RepeatedField<long>::elements
                        ((RepeatedField<long> *)(pEVar7->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])
                          (((RepeatedField<long> *)(pEVar7->field_0).int64_t_value)->soo_rep_).
                          field_0 & (undefined1  [16])0x4) == (undefined1  [16])0x0);
    goto LAB_0023c7ff;
  case 3:
    puVar8 = RepeatedField<unsigned_int>::elements
                       ((RepeatedField<unsigned_int> *)(pEVar7->field_0).int64_t_value,
                        (undefined1  [16])
                        ((undefined1  [16])
                         (((RepeatedField<unsigned_int> *)(pEVar7->field_0).int64_t_value)->soo_rep_
                         ).field_0 & (undefined1  [16])0x4) == (undefined1  [16])0x0);
LAB_0023c82b:
    uVar4 = puVar8[index1];
    puVar8[index1] = puVar8[index2];
    puVar8[index2] = uVar4;
    break;
  case 4:
    puVar11 = RepeatedField<unsigned_long>::elements
                        ((RepeatedField<unsigned_long> *)(pEVar7->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])
                          (((RepeatedField<unsigned_long> *)(pEVar7->field_0).int64_t_value)->
                          soo_rep_).field_0 & (undefined1  [16])0x4) == (undefined1  [16])0x0);
LAB_0023c7ff:
    uVar6 = puVar11[index1];
    puVar11[index1] = puVar11[index2];
    puVar11[index2] = uVar6;
    break;
  case 5:
    pdVar13 = RepeatedField<double>::elements
                        ((RepeatedField<double> *)(pEVar7->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])
                          (((RepeatedField<double> *)(pEVar7->field_0).int64_t_value)->soo_rep_).
                          field_0 & (undefined1  [16])0x4) == (undefined1  [16])0x0);
    dVar2 = pdVar13[index1];
    pdVar13[index1] = pdVar13[index2];
    pdVar13[index2] = dVar2;
    break;
  case 6:
    pfVar14 = RepeatedField<float>::elements
                        ((RepeatedField<float> *)(pEVar7->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])
                          (((RepeatedField<float> *)(pEVar7->field_0).int64_t_value)->soo_rep_).
                          field_0 & (undefined1  [16])0x4) == (undefined1  [16])0x0);
    fVar1 = pfVar14[index1];
    pfVar14[index1] = pfVar14[index2];
    pfVar14[index2] = fVar1;
    break;
  case 7:
    pbVar12 = RepeatedField<bool>::elements
                        ((RepeatedField<bool> *)(pEVar7->field_0).int64_t_value,
                         (undefined1  [16])
                         ((undefined1  [16])
                          (((RepeatedField<bool> *)(pEVar7->field_0).int64_t_value)->soo_rep_).
                          field_0 & (undefined1  [16])0x4) == (undefined1  [16])0x0);
    bVar3 = pbVar12[index1];
    pbVar12[index1] = pbVar12[index2];
    pbVar12[index2] = bVar3;
    break;
  case 9:
  case 10:
    this_00 = pEVar7->field_0;
    ppvVar9 = RepeatedPtrFieldBase::element_at((RepeatedPtrFieldBase *)this_00,index1);
    ppvVar10 = RepeatedPtrFieldBase::element_at((RepeatedPtrFieldBase *)this_00,index2);
    pvVar5 = *ppvVar9;
    *ppvVar9 = *ppvVar10;
    *ppvVar10 = pvVar5;
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->ptr.repeated_int32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->ptr.repeated_int64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->ptr.repeated_uint32_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->ptr.repeated_uint64_t_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->ptr.repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->ptr.repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->ptr.repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->ptr.repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->ptr.repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->ptr.repeated_message_value->SwapElements(index1, index2);
      break;
  }
}